

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O1

ParameterError parse_args(GlobalConfig *config,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  ParameterError res;
  char *pcVar3;
  OperationConfig *pOVar4;
  OperationConfig *config_00;
  char *nextarg;
  _Bool passarg;
  _Bool used;
  _Bool local_4a;
  _Bool local_49;
  GlobalConfig *local_48;
  uint local_40;
  int local_3c;
  char **local_38;
  
  local_48 = config;
  local_38 = argv;
  if (argc < 2) {
    res = PARAM_OK;
    nextarg = (char *)0x0;
  }
  else {
    config_00 = config->first;
    local_3c = argc + -1;
    res = PARAM_OK;
    local_40 = (uint)CONCAT71((uint7)(uint3)((uint)local_3c >> 8),1);
    iVar1 = 1;
    do {
      nextarg = local_38[iVar1];
      if (((local_40 & 1) == 0) || (*nextarg != '-')) {
        res = getparameter("--url",nextarg,&local_49,local_48,config_00);
      }
      else {
        iVar2 = strcmp("--",nextarg);
        if (iVar2 == 0) {
          local_40 = 0;
        }
        else {
          if (iVar1 < local_3c) {
            pcVar3 = local_38[(long)iVar1 + 1];
          }
          else {
            pcVar3 = (char *)0x0;
          }
          res = getparameter(nextarg,pcVar3,&local_4a,local_48,config_00);
          if (res == PARAM_OK) {
            iVar1 = iVar1 + (uint)local_4a;
            res = PARAM_OK;
          }
          else if (res == PARAM_NEXT_OPERATION) {
            res = PARAM_OK;
            if ((config_00->url_list != (getout *)0x0) &&
               (res = PARAM_OK, config_00->url_list->url != (char *)0x0)) {
              pOVar4 = (OperationConfig *)malloc(0x480);
              config_00->next = pOVar4;
              if (pOVar4 == (OperationConfig *)0x0) {
                res = PARAM_NO_MEM;
              }
              else {
                config_init(pOVar4);
                pOVar4 = config_00->next;
                pOVar4->easy = local_48->easy;
                pOVar4->global = local_48;
                local_48->last = pOVar4;
                pOVar4->prev = config_00;
                config_00 = pOVar4;
              }
            }
          }
        }
      }
      iVar1 = iVar1 + 1;
    } while ((iVar1 < argc) && (res == PARAM_OK));
  }
  if ((3 < res - PARAM_HELP_REQUESTED) && (res != PARAM_OK)) {
    pcVar3 = param2text(res);
    if ((nextarg == (char *)0x0) || (iVar1 = strcmp(":",nextarg), iVar1 == 0)) {
      helpf(local_48->errors,"%s\n",pcVar3);
    }
    else {
      helpf(local_48->errors,"option %s: %s\n",nextarg,pcVar3);
    }
  }
  return res;
}

Assistant:

ParameterError parse_args(struct GlobalConfig *config, int argc,
                          argv_item_t argv[])
{
  int i;
  bool stillflags;
  char *orig_opt = NULL;
  ParameterError result = PARAM_OK;
  struct OperationConfig *operation = config->first;

  for(i = 1, stillflags = TRUE; i < argc && !result; i++) {
    orig_opt = argv[i];

    if(stillflags && ('-' == argv[i][0])) {
      char *nextarg;
      bool passarg;
      char *flag = argv[i];

      if(!strcmp("--", argv[i]))
        /* This indicates the end of the flags and thus enables the
           following (URL) argument to start with -. */
        stillflags = FALSE;
      else {
        nextarg = (i < (argc - 1)) ? argv[i + 1] : NULL;

        result = getparameter(flag, nextarg, &passarg, config, operation);
        if(result == PARAM_NEXT_OPERATION) {
          /* Reset result as PARAM_NEXT_OPERATION is only used here and not
             returned from this function */
          result = PARAM_OK;

          if(operation->url_list && operation->url_list->url) {
            /* Allocate the next config */
            operation->next = malloc(sizeof(struct OperationConfig));
            if(operation->next) {
              /* Initialise the newly created config */
              config_init(operation->next);

              /* Copy the easy handle */
              operation->next->easy = config->easy;

              /* Set the global config pointer */
              operation->next->global = config;

              /* Update the last operation pointer */
              config->last = operation->next;

              /* Move onto the new config */
              operation->next->prev = operation;
              operation = operation->next;
            }
            else
              result = PARAM_NO_MEM;
          }
        }
        else if(!result && passarg)
          i++; /* we're supposed to skip this */
      }
    }
    else {
      bool used;

      /* Just add the URL please */
      result = getparameter((char *)"--url", argv[i], &used, config,
                            operation);
    }
  }

  if(result && result != PARAM_HELP_REQUESTED &&
     result != PARAM_MANUAL_REQUESTED &&
     result != PARAM_VERSION_INFO_REQUESTED &&
     result != PARAM_ENGINES_REQUESTED) {
    const char *reason = param2text(result);

    if(orig_opt && strcmp(":", orig_opt))
      helpf(config->errors, "option %s: %s\n", orig_opt, reason);
    else
      helpf(config->errors, "%s\n", reason);
  }

  return result;
}